

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::NoteOldRevision(cmCTestSVN *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *msg;
  string local_200 [48];
  ostringstream local_1d0 [8];
  ostringstream cmCTestLog_msg;
  string local_58;
  reference local_38;
  SVNInfo *svninfo;
  iterator __end1;
  iterator __begin1;
  list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_> *__range1;
  cmCTestSVN *this_local;
  
  bVar1 = LoadRepositories(this);
  if (bVar1) {
    __end1 = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::begin
                       (&this->Repositories);
    svninfo = (SVNInfo *)
              std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::end
                        (&this->Repositories);
    while( true ) {
      bVar1 = std::operator!=(&__end1,(_Self *)&svninfo);
      if (!bVar1) break;
      local_38 = std::_List_iterator<cmCTestSVN::SVNInfo>::operator*(&__end1);
      LoadInfo_abi_cxx11_(&local_58,this,local_38);
      std::__cxx11::string::operator=((string *)&local_38->OldRevision,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                               "Revision for repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      poVar2 = std::operator<<(poVar2,"\' before update: ");
      poVar2 = std::operator<<(poVar2,(string *)&local_38->OldRevision);
      std::operator<<(poVar2,"\n");
      std::__cxx11::ostringstream::ostringstream(local_1d0);
      poVar2 = std::operator<<((ostream *)local_1d0,"   Old revision of external repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      poVar2 = std::operator<<(poVar2,"\' is: ");
      poVar2 = std::operator<<(poVar2,(string *)&local_38->OldRevision);
      std::operator<<(poVar2,"\n");
      this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_00,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSVN.cxx"
                   ,0x73,msg,false);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::ostringstream::~ostringstream(local_1d0);
      std::_List_iterator<cmCTestSVN::SVNInfo>::operator++(&__end1);
    }
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmCTestGlobalVC).OldRevision,
               (string *)&this->RootInfo->OldRevision);
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmCTestGlobalVC).PriorRev,
               (string *)&(this->super_cmCTestGlobalVC).OldRevision);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestSVN::NoteOldRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  for (SVNInfo& svninfo : this->Repositories) {
    svninfo.OldRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' before update: " << svninfo.OldRevision << "\n";
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Old revision of external repository '"
                 << svninfo.LocalPath << "' is: " << svninfo.OldRevision
                 << "\n");
  }

  // Set the global old revision to the one of the root
  this->OldRevision = this->RootInfo->OldRevision;
  this->PriorRev.Rev = this->OldRevision;
  return true;
}